

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  byte bVar2;
  connectdata *conn;
  byte *pbVar3;
  byte *pbVar4;
  char cVar5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  curl_slist *pcVar12;
  long lVar13;
  char *pcVar14;
  curl_slist *pcVar15;
  byte *pbVar16;
  curl_slist *list;
  char *pcVar17;
  char *pcVar18;
  uchar *input;
  uchar *data_00;
  uchar *data_01;
  uchar *key;
  byte *pbVar19;
  byte *pbVar20;
  char *pcVar21;
  curl_slist *pcVar22;
  ulong uVar23;
  char *tmp;
  bool bVar24;
  bool bVar25;
  CURLcode local_594;
  char *local_590;
  char *local_580;
  Curl_HttpReq httpreq;
  char timestamp [17];
  char *method;
  uchar sign0 [32];
  char service [65];
  uchar sign1 [32];
  char region [65];
  char provider0 [65];
  char provider1 [65];
  dynbuf canonical_query;
  dynbuf signed_headers;
  uchar sha_hash [32];
  dynbuf canonical_headers;
  time_t clock;
  char sha_hex [65];
  char content_sha256_hdr [151];
  char date_hdr_key [72];
  tm tm;
  char date [9];
  char date_full_hdr [90];
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar14 = (conn->host).name;
  method = (char *)0x0;
  memset(content_sha256_hdr,0,0x97);
  pcVar21 = (data->state).aptr.user;
  if (pcVar21 == (char *)0x0) {
    pcVar21 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar8 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar8 != (char *)0x0) {
    return CURLE_OK;
  }
  local_590 = "";
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&canonical_query,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  pcVar8 = (data->set).str[0x4c];
  pcVar11 = "aws:amz";
  if (pcVar8 != (char *)0x0) {
    pcVar11 = pcVar8;
  }
  __isoc99_sscanf(pcVar11,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    local_580 = (char *)0x0;
    Curl_failf(data,"first aws-sigv4 provider can\'t be empty");
    local_594 = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_0014445b;
  }
  if (provider1[0] == '\0') {
    strcpy(provider1,provider0);
  }
  if (service[0] == '\0') {
    pcVar8 = strchr(pcVar14,0x2e);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "aws-sigv4: service missing in parameters and hostname";
LAB_0014401e:
      bVar24 = false;
      Curl_failf(data,pcVar8);
      local_594 = CURLE_URL_MALFORMAT;
    }
    else {
      uVar23 = (long)pcVar8 - (long)pcVar14;
      if (0x40 < uVar23) {
        pcVar8 = "aws-sigv4: service too long in hostname";
        goto LAB_0014401e;
      }
      memcpy(service,pcVar14,uVar23);
      service[uVar23] = '\0';
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"aws_sigv4: picked service %s from host",service);
      }
      local_594 = CURLE_OUT_OF_MEMORY;
      bVar24 = true;
      if (region[0] == '\0') {
        pcVar8 = pcVar8 + 1;
        pcVar11 = strchr(pcVar8,0x2e);
        if (pcVar11 == (char *)0x0) {
          pcVar8 = "aws-sigv4: region missing in parameters and hostname";
        }
        else {
          uVar23 = (long)pcVar11 - (long)pcVar8;
          if (uVar23 < 0x41) {
            memcpy(region,pcVar8,uVar23);
            region[uVar23] = '\0';
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"aws_sigv4: picked region %s from host",region);
            }
            goto LAB_0014408f;
          }
          pcVar8 = "aws-sigv4: region too long in hostname";
        }
        goto LAB_0014401e;
      }
    }
LAB_0014408f:
    if (bVar24) goto LAB_00144097;
LAB_0014444d:
    local_580 = (char *)0x0;
LAB_0014445b:
    data_00 = (uchar *)0x0;
    input = (uchar *)0x0;
    pcVar14 = (char *)0x0;
  }
  else {
LAB_00144097:
    Curl_http_method(data,conn,&method,&httpreq);
    iVar6 = curl_strequal(provider0,"aws");
    if (iVar6 == 0) {
      bVar24 = false;
    }
    else {
      iVar6 = curl_strequal(service,"s3");
      bVar24 = iVar6 != 0;
    }
    iVar6 = curl_msnprintf(date,0x52,"x-%s-content-sha256",provider1);
    pcVar8 = Curl_checkheaders(data,date,(long)iVar6);
    if ((pcVar8 == (char *)0x0) || (pcVar8 = strchr(pcVar8,0x3a), pcVar8 == (char *)0x0)) {
      sVar9 = 0;
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        do {
          pcVar11 = pcVar8;
          pcVar8 = pcVar11 + 1;
        } while (*pcVar8 == ' ');
      } while (*pcVar8 == '\t');
      sVar9 = strlen(pcVar8);
      if (sVar9 != 0) {
        do {
          cVar5 = pcVar11[sVar9];
          if ((cVar5 != ' ') && (cVar5 != '\t')) goto LAB_00144173;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
        sVar9 = 0;
      }
    }
LAB_00144173:
    if (pcVar8 == (char *)0x0) {
      if (bVar24) {
        bVar24 = true;
        if ((httpreq != HTTPREQ_GET) && (httpreq != HTTPREQ_HEAD)) {
          bVar24 = (data->set).filesize == 0;
        }
        if (httpreq == HTTPREQ_POST) {
          bVar25 = (data->set).postfields != (void *)0x0;
        }
        else {
          bVar25 = false;
        }
        if ((bool)(bVar24 | bVar25)) {
          local_594 = calc_payload_hash(data,sha_hash,sha_hex);
          if (local_594 != CURLE_OK) goto LAB_00144441;
        }
        else {
          builtin_strncpy(sha_hex,"UNSIGNED-PAYLOAD",0x11);
        }
        local_594 = CURLE_OK;
        curl_msnprintf(content_sha256_hdr,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
      }
      else {
        local_594 = calc_payload_hash(data,sha_hash,sha_hex);
      }
LAB_00144441:
      if (local_594 != CURLE_OK) goto LAB_0014444d;
      pcVar8 = sha_hex;
      sVar9 = strlen(pcVar8);
    }
    time(&clock);
    local_594 = Curl_gmtime(clock,&tm);
    if (local_594 != CURLE_OK) goto LAB_0014444d;
    sVar10 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
    if (sVar10 == 0) {
      local_594 = CURLE_OUT_OF_MEMORY;
      goto LAB_0014444d;
    }
    sVar10 = strlen(provider1);
    Curl_strntolower(provider1,provider1,sVar10);
    cVar5 = Curl_raw_toupper(provider1[0]);
    provider1[0] = cVar5;
    list = (curl_slist *)0x0;
    curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
    Curl_strntolower(provider1,provider1,1);
    curl_msnprintf(date_full_hdr,0x5a,"x-%s-date:%s",provider1,timestamp);
    pcVar11 = Curl_checkheaders(data,"Host",4);
    if (pcVar11 == (char *)0x0) {
      pcVar11 = (data->state).aptr.host;
      if (pcVar11 == (char *)0x0) {
        sVar10 = strlen(pcVar14);
        if (sVar10 < 0x100) {
          curl_msnprintf(date,0x105,"host:%s",pcVar14);
          goto LAB_00144919;
        }
        pcVar22 = (curl_slist *)0x3;
        bVar24 = true;
        list = (curl_slist *)0x0;
      }
      else {
        sVar10 = strlen(pcVar11);
        if (sVar10 < 0x106) {
          strcpy(date,pcVar11);
          sVar10 = strcspn(date,"\n\r");
          date[sVar10] = '\0';
LAB_00144919:
          pcVar22 = (curl_slist *)0x1b;
          list = curl_slist_append((curl_slist *)0x0,date);
          bVar24 = list == (curl_slist *)0x0;
        }
        else {
          pcVar22 = (curl_slist *)0x3;
          bVar24 = true;
          list = (curl_slist *)0x0;
        }
      }
      local_580 = (char *)0x0;
      if (bVar24) goto LAB_00144952;
      pcVar12 = pcVar22;
      local_580 = (char *)0x0;
      if (!bVar24) goto LAB_001442ac;
    }
    else {
      pcVar22 = (curl_slist *)0x1b;
LAB_001442ac:
      pcVar12 = list;
      if ((content_sha256_hdr[0] == '\0') ||
         (pcVar12 = curl_slist_append(list,content_sha256_hdr), pcVar12 != (curl_slist *)0x0)) {
        list = pcVar12;
        for (pcVar12 = (data->set).headers; pcVar15 = list, pcVar12 != (curl_slist *)0x0;
            pcVar12 = pcVar12->next) {
          pcVar14 = pcVar12->data;
          pcVar11 = strchr(pcVar14,0x3a);
          if (pcVar11 == (char *)0x0) {
            pcVar11 = strchr(pcVar14,0x3b);
          }
          iVar6 = 5;
          if ((pcVar11 != (char *)0x0) && ((*pcVar11 != ':' || (pcVar11[1] != '\0')))) {
            lVar13 = 0;
            while (((cVar5 = pcVar11[lVar13 + 1], cVar5 == '\t' || (cVar5 == ' ')) ||
                   ((byte)(cVar5 - 10U) < 4))) {
              lVar13 = lVar13 + 1;
            }
            if ((lVar13 == 0) || (cVar5 != '\0')) {
              pcVar14 = (*Curl_cstrdup)(pcVar14);
              iVar6 = 2;
              if (pcVar14 != (char *)0x0) {
                pcVar14[(long)pcVar11 - (long)pcVar12->data] = ':';
                pcVar15 = Curl_slist_append_nodup(list,pcVar14);
                if (pcVar15 == (curl_slist *)0x0) {
                  (*Curl_cfree)(pcVar14);
                  iVar6 = 2;
                }
                else {
                  iVar6 = 0;
                  list = pcVar15;
                }
              }
            }
          }
          if ((iVar6 != 0) && (iVar6 != 5)) {
            local_580 = (char *)0x0;
            if (iVar6 == 2) goto LAB_00144952;
            goto LAB_0014495a;
          }
        }
        for (; pcVar15 != (curl_slist *)0x0; pcVar15 = pcVar15->next) {
          pcVar14 = pcVar15->data;
          sVar10 = strcspn(pcVar14,":");
          Curl_strntolower(pcVar14,pcVar14,sVar10);
          if (pcVar15->data[sVar10] != '\0') {
            pcVar14 = pcVar15->data + sVar10 + 1;
            for (pcVar11 = pcVar14; (cVar5 = *pcVar11, cVar5 == '\t' || (cVar5 == ' '));
                pcVar11 = pcVar11 + 1) {
            }
            while (cVar5 != '\0') {
              iVar6 = 0;
              for (; (cVar5 = *pcVar11, cVar5 == ' ' || (cVar5 == '\t')); pcVar11 = pcVar11 + 1) {
                iVar6 = iVar6 + -1;
              }
              if (iVar6 == 0) {
                pcVar11 = pcVar11 + 1;
LAB_00144561:
                *pcVar14 = cVar5;
                pcVar14 = pcVar14 + 1;
              }
              else {
                bVar24 = cVar5 != '\0';
                cVar5 = ' ';
                if (bVar24) goto LAB_00144561;
              }
              cVar5 = *pcVar11;
            }
            *pcVar14 = '\0';
          }
        }
        sVar10 = strlen(date_hdr_key);
        pcVar14 = Curl_checkheaders(data,date_hdr_key,sVar10);
        if (pcVar14 == (char *)0x0) {
          pcVar14 = Curl_checkheaders(data,"Date",4);
        }
        if (pcVar14 == (char *)0x0) {
          pcVar12 = curl_slist_append(list,date_full_hdr);
          if (pcVar12 == (curl_slist *)0x0) {
            local_580 = (char *)0x0;
          }
          else {
            local_580 = curl_maprintf("%s: %s\r\n",date_hdr_key,timestamp);
            list = pcVar12;
LAB_001447fe:
            if (list == (curl_slist *)0x0) {
              pcVar22 = (curl_slist *)0x0;
            }
            else {
              pcVar12 = list;
              bVar24 = false;
              do {
                bVar25 = bVar24;
                pcVar15 = pcVar12->next;
                if (pcVar15 != (curl_slist *)0x0) {
                  pcVar14 = pcVar12->data;
                  pcVar11 = pcVar15->data;
                  iVar6 = strcmp(pcVar14,pcVar11);
                  if (0 < iVar6) {
                    pcVar12->data = pcVar11;
                    pcVar15->data = pcVar14;
                    bVar25 = true;
                  }
                }
                pcVar12 = pcVar15;
                bVar24 = bVar25;
              } while ((pcVar15 != (curl_slist *)0x0) || (pcVar12 = list, bVar24 = false, bVar25));
              do {
                CVar7 = Curl_dyn_add(&canonical_headers,pcVar12->data);
                if ((CVar7 != CURLE_OK) ||
                   (CVar7 = Curl_dyn_add(&canonical_headers,"\n"), CVar7 != CURLE_OK))
                goto LAB_00144952;
                pcVar14 = strchr(pcVar12->data,0x3a);
                if (pcVar14 != (char *)0x0) {
                  *pcVar14 = '\0';
                }
                if (((pcVar12 != list) &&
                    (CVar7 = Curl_dyn_add(&signed_headers,";"), CVar7 != CURLE_OK)) ||
                   (CVar7 = Curl_dyn_add(&signed_headers,pcVar12->data), CVar7 != CURLE_OK))
                goto LAB_00144952;
                pcVar12 = pcVar12->next;
              } while (pcVar12 != (curl_slist *)0x0);
              pcVar22 = (curl_slist *)0x0;
            }
          }
        }
        else {
          pbVar16 = (byte *)strchr(pcVar14,0x3a);
          if (pbVar16 == (byte *)0x0) {
            local_580 = (char *)0x0;
          }
          else {
            pbVar20 = pbVar16 + 0x11;
            pbVar3 = pbVar16;
            while( true ) {
              pbVar19 = pbVar3 + 1;
              bVar2 = *pbVar19;
              if ((bVar2 != 9) && (pbVar4 = pbVar19, bVar2 != 0x20)) break;
              pbVar20 = pbVar20 + 1;
              pbVar3 = pbVar19;
            }
            while ((bVar2 != 0 &&
                   (((byte)(bVar2 - 0x30) < 10 || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a))))) {
              bVar2 = pbVar4[1];
              pbVar4 = pbVar4 + 1;
            }
            if (pbVar4 == pbVar20) {
              timestamp._0_8_ = *(undefined8 *)pbVar19;
              timestamp._8_8_ = *(undefined8 *)(pbVar3 + 9);
              timestamp[0x10] = '\0';
            }
            else {
              timestamp._0_8_ = timestamp._0_8_ & 0xffffffffffffff00;
            }
            local_580 = (char *)0x0;
            if (pbVar16 != (byte *)0x0) goto LAB_001447fe;
          }
        }
      }
      else {
        local_580 = (char *)0x0;
      }
LAB_00144952:
      curl_slist_free_all(list);
      pcVar12 = pcVar22;
    }
LAB_0014495a:
    local_594 = (CURLcode)pcVar12;
    if (local_594 != CURLE_OK) goto LAB_0014445b;
    if (content_sha256_hdr[0] != '\0') {
      sVar10 = strlen(content_sha256_hdr);
      (content_sha256_hdr + sVar10)[0] = '\r';
      (content_sha256_hdr + sVar10)[1] = '\n';
      content_sha256_hdr[sVar10 + 2] = '\0';
    }
    date[0] = timestamp[0];
    date[1] = timestamp[1];
    date[2] = timestamp[2];
    date[3] = timestamp[3];
    date[4] = timestamp[4];
    date[5] = timestamp[5];
    date[6] = timestamp[6];
    date[7] = timestamp[7];
    date[8] = '\0';
    local_594 = canon_query(data,(data->state).up.query,&canonical_query);
    pcVar14 = method;
    if (local_594 != CURLE_OK) goto LAB_0014445b;
    pcVar11 = (data->state).up.path;
    pcVar17 = Curl_dyn_ptr(&canonical_query);
    if (pcVar17 != (char *)0x0) {
      local_590 = Curl_dyn_ptr(&canonical_query);
    }
    pcVar17 = Curl_dyn_ptr(&canonical_headers);
    pcVar18 = Curl_dyn_ptr(&signed_headers);
    input = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar14,pcVar11,local_590,pcVar17,
                                   pcVar18,sVar9,pcVar8);
    local_594 = CURLE_OUT_OF_MEMORY;
    if (input == (uchar *)0x0) goto LAB_0014445b;
    sVar9 = strlen(provider0);
    Curl_strntolower(provider0,provider0,sVar9);
    data_00 = (uchar *)curl_maprintf("%s4_request",provider0);
    if (data_00 == (uchar *)0x0) {
      data_00 = (uchar *)0x0;
LAB_00144b1a:
      data_01 = (uchar *)0x0;
      pcVar14 = (char *)0x0;
      key = (uchar *)0x0;
      goto LAB_00144464;
    }
    pcVar14 = curl_maprintf("%s/%s/%s/%s",date,region,service,data_00);
    if (pcVar14 == (char *)0x0) goto LAB_00144b1a;
    sVar9 = strlen((char *)input);
    CVar7 = Curl_sha256it(sha_hash,input,sVar9);
    if (CVar7 != CURLE_OK) {
      data_01 = (uchar *)0x0;
LAB_00144afe:
      key = (uchar *)0x0;
      goto LAB_00144464;
    }
    Curl_hexencode(sha_hash,0x20,(uchar *)sha_hex,0x41);
    sVar9 = strlen(provider0);
    Curl_strntoupper(provider0,provider0,sVar9);
    data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,pcVar14,
                                     sha_hex);
    if (data_01 != (uchar *)0x0) {
      pcVar8 = (data->state).aptr.passwd;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "";
      }
      key = (uchar *)curl_maprintf("%s4%s",provider0,pcVar8);
      if (key != (uchar *)0x0) {
        sVar9 = strlen((char *)key);
        sVar10 = strlen(date);
        local_594 = Curl_hmacit(Curl_HMAC_SHA256,key,sVar9,(uchar *)date,sVar10,sign0);
        if (local_594 == CURLE_OK) {
          sVar9 = strlen(region);
          local_594 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,sVar9,sign1);
          if (local_594 == CURLE_OK) {
            sVar9 = strlen(service);
            local_594 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,sVar9,sign0);
            if (local_594 == CURLE_OK) {
              sVar9 = strlen((char *)data_00);
              local_594 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,data_00,sVar9,sign1);
              if (local_594 == CURLE_OK) {
                sVar9 = strlen((char *)data_01);
                local_594 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_01,sVar9,sign0);
                if (local_594 == CURLE_OK) {
                  Curl_hexencode(sign0,0x20,(uchar *)sha_hex,0x41);
                  pcVar11 = Curl_dyn_ptr(&signed_headers);
                  pcVar8 = "";
                  if (local_580 != (char *)0x0) {
                    pcVar8 = local_580;
                  }
                  local_594 = CURLE_OK;
                  pcVar21 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                          ,provider0,pcVar21,pcVar14,pcVar11,sha_hex,pcVar8,
                                          content_sha256_hdr);
                  if (pcVar21 != (char *)0x0) {
                    (*Curl_cfree)((data->state).aptr.userpwd);
                    (data->state).aptr.userpwd = pcVar21;
                    puVar1 = &(data->state).authhost.field_0x18;
                    *puVar1 = *puVar1 | 1;
                  }
                }
              }
            }
          }
        }
        goto LAB_00144464;
      }
      goto LAB_00144afe;
    }
  }
  data_01 = (uchar *)0x0;
  key = (uchar *)0x0;
LAB_00144464:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(input);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_580);
  return local_594;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = false;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider can't be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    curl_maprintf("%s\n" /* HTTPRequestMethod */
                  "%s\n" /* CanonicalURI */
                  "%s\n" /* CanonicalQueryString */
                  "%s\n" /* CanonicalHeaders */
                  "%s\n" /* SignedHeaders */
                  "%.*s",  /* HashedRequestPayload in hex */
                  method,
                  data->state.up.path,
                  Curl_dyn_ptr(&canonical_query) ?
                  Curl_dyn_ptr(&canonical_query) : "",
                  Curl_dyn_ptr(&canonical_headers),
                  Curl_dyn_ptr(&signed_headers),
                  (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               /*
                                * date_header is added here, only if it wasn't
                                * user-specified (using CURLOPT_HTTPHEADER).
                                * date_header includes \r\n
                                */
                               "%s"
                               "%s", /* optional sha256 header includes \r\n */
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header ? date_header : "",
                               content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}